

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMRangeImpl.cpp
# Opt level: O2

DOMNode * __thiscall
xercesc_4_0::DOMRangeImpl::traverseTextNode(DOMRangeImpl *this,DOMNode *n,bool isLeft,int how)

{
  int iVar1;
  undefined4 extraout_var;
  XMLCh *pXVar2;
  undefined4 extraout_var_00;
  XMLSize_t XVar3;
  ulong uVar4;
  XMLCh *pXVar5;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  XMLCh *pXVar6;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined7 in_register_00000011;
  DOMNode *pDVar7;
  ArrayJanitor<char16_t> janValue;
  XMLCh oldTemp [4000];
  ArrayJanitor<char16_t> local_1f88;
  XMLCh local_1f78 [4004];
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  iVar1 = (*n->_vptr_DOMNode[3])(n);
  pXVar2 = XMLString::replicate((XMLCh *)CONCAT44(extraout_var,iVar1),this->fMemoryManager);
  ArrayJanitor<char16_t>::ArrayJanitor(&local_1f88,pXVar2,this->fMemoryManager);
  if ((int)CONCAT71(in_register_00000011,isLeft) == 0) {
    iVar1 = (*this->fEndContainer->_vptr_DOMNode[3])();
    XVar3 = XMLString::stringLen((XMLCh *)CONCAT44(extraout_var_03,iVar1));
    iVar1 = (*(this->super_DOMRange)._vptr_DOMRange[5])(this);
    uVar4 = CONCAT44(extraout_var_04,iVar1);
    if (XVar3 == uVar4) {
      if (how != 2) {
        (*n->_vptr_DOMNode[0x13])(n,&XMLUni::fgZeroLenString);
        goto LAB_00289249;
      }
LAB_00289256:
      iVar1 = (*n->_vptr_DOMNode[0xd])(n,0);
      pDVar7 = (DOMNode *)CONCAT44(extraout_var_08,iVar1);
      if (uVar4 == 0) {
        (*pDVar7->_vptr_DOMNode[0x13])(pDVar7,&XMLUni::fgZeroLenString);
      }
      else {
        if (uVar4 < 3999) {
          pXVar5 = local_1f78;
        }
        else {
          iVar1 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                            (this->fMemoryManager,uVar4 * 2 + 2);
          pXVar5 = (XMLCh *)CONCAT44(extraout_var_09,iVar1);
        }
        XMLString::subString
                  (pXVar5,pXVar2,0,uVar4,
                   (MemoryManager *)this->fDocument[10].super_DOMNode._vptr_DOMNode);
        pXVar2 = DOMDocumentImpl::getPooledString
                           ((DOMDocumentImpl *)&this->fDocument[-1].super_DOMNode,pXVar5);
        (*pDVar7->_vptr_DOMNode[0x13])(pDVar7,pXVar2);
        if (0xf9e < uVar4) {
          (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,pXVar5);
        }
      }
      goto LAB_00289352;
    }
    if (uVar4 < 3999) {
      pXVar5 = local_1f78;
    }
    else {
      iVar1 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,uVar4 * 2 + 2);
      pXVar5 = (XMLCh *)CONCAT44(extraout_var_05,iVar1);
    }
    XMLString::subString
              (pXVar5,pXVar2,uVar4,XVar3,
               (MemoryManager *)this->fDocument[10].super_DOMNode._vptr_DOMNode);
    if (how != 2) {
      pXVar6 = DOMDocumentImpl::getPooledString
                         ((DOMDocumentImpl *)&this->fDocument[-1].super_DOMNode,pXVar5);
      (*n->_vptr_DOMNode[0x13])(n,pXVar6);
    }
    if (0xf9e < uVar4) {
      (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,pXVar5);
    }
LAB_00289249:
    if (how != 3) goto LAB_00289256;
LAB_0028924e:
    pDVar7 = (DOMNode *)0x0;
  }
  else {
    iVar1 = (*this->fStartContainer->_vptr_DOMNode[3])();
    XVar3 = XMLString::stringLen((XMLCh *)CONCAT44(extraout_var_00,iVar1));
    iVar1 = (*(this->super_DOMRange)._vptr_DOMRange[3])(this);
    uVar4 = CONCAT44(extraout_var_01,iVar1);
    if (uVar4 == 0) {
      if (how != 2) {
        (*n->_vptr_DOMNode[0x13])(n,&XMLUni::fgZeroLenString);
        goto LAB_00289191;
      }
    }
    else {
      if (uVar4 < 3999) {
        pXVar5 = local_1f78;
      }
      else {
        iVar1 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,uVar4 * 2 + 2);
        pXVar5 = (XMLCh *)CONCAT44(extraout_var_02,iVar1);
      }
      XMLString::subString
                (pXVar5,pXVar2,0,uVar4,
                 (MemoryManager *)this->fDocument[10].super_DOMNode._vptr_DOMNode);
      if (how != 2) {
        pXVar6 = DOMDocumentImpl::getPooledString
                           ((DOMDocumentImpl *)&this->fDocument[-1].super_DOMNode,pXVar5);
        (*n->_vptr_DOMNode[0x13])(n,pXVar6);
      }
      if (0xf9e < uVar4) {
        (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,pXVar5);
      }
LAB_00289191:
      if (how == 3) goto LAB_0028924e;
    }
    iVar1 = (*n->_vptr_DOMNode[0xd])(n,0);
    pDVar7 = (DOMNode *)CONCAT44(extraout_var_06,iVar1);
    if (XVar3 == uVar4) {
      (*pDVar7->_vptr_DOMNode[0x13])(pDVar7,&XMLUni::fgZeroLenString);
    }
    else {
      if (uVar4 < 3999) {
        pXVar5 = local_1f78;
      }
      else {
        iVar1 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,uVar4 * 2 + 2);
        pXVar5 = (XMLCh *)CONCAT44(extraout_var_07,iVar1);
      }
      XMLString::subString
                (pXVar5,pXVar2,uVar4,XVar3,
                 (MemoryManager *)this->fDocument[10].super_DOMNode._vptr_DOMNode);
      pXVar2 = DOMDocumentImpl::getPooledString
                         ((DOMDocumentImpl *)&this->fDocument[-1].super_DOMNode,pXVar5);
      (*pDVar7->_vptr_DOMNode[0x13])(pDVar7,pXVar2);
      if (0xf9e < uVar4) {
        (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,pXVar5);
      }
    }
  }
LAB_00289352:
  ArrayJanitor<char16_t>::~ArrayJanitor(&local_1f88);
  return pDVar7;
}

Assistant:

DOMNode* DOMRangeImpl::traverseTextNode( DOMNode*n, bool isLeft, int how )
{
    XMLCh* txtValue = XMLString::replicate(n->getNodeValue(), fMemoryManager);
    ArrayJanitor<XMLCh> janValue(txtValue, fMemoryManager);

    if ( isLeft )
    {
        XMLSize_t startLen = XMLString::stringLen(fStartContainer->getNodeValue());
        XMLSize_t offset = getStartOffset();

        if (offset == 0) {
            if ( how != CLONE_CONTENTS )
                n->setNodeValue(XMLUni::fgZeroLenString);
        }
        else {
            XMLCh* oldNodeValue;
            XMLCh oldTemp[4000];

            if (offset >= 3999)  {
                oldNodeValue = (XMLCh*) fMemoryManager->allocate
                (
                    (offset+1) * sizeof(XMLCh)
                );//new XMLCh[offset+1];
            }
            else {
                oldNodeValue = oldTemp;
            }
            XMLString::subString(oldNodeValue, txtValue, 0, offset, ((DOMDocumentImpl *)fDocument)->getMemoryManager());

            if ( how != CLONE_CONTENTS )
                n->setNodeValue( ((DOMDocumentImpl *)fDocument)->getPooledString(oldNodeValue) );

            if (offset>= 3999)
                fMemoryManager->deallocate(oldNodeValue);//delete[] oldNodeValue;
        }

        if ( how==DELETE_CONTENTS )
            return 0;

        DOMNode* newNode = n->cloneNode( false );

        if (startLen == offset) {
            newNode->setNodeValue(XMLUni::fgZeroLenString);
        }
        else {
            XMLCh* newNodeValue;
            XMLCh newTemp[4000];

            if (offset >= 3999)  {
                newNodeValue = (XMLCh*) fMemoryManager->allocate
                (
                    (offset+1) * sizeof(XMLCh)
                );//new XMLCh[offset+1];
            }
            else {
                newNodeValue = newTemp;
            }
            XMLString::subString(newNodeValue, txtValue, offset, startLen, ((DOMDocumentImpl *)fDocument)->getMemoryManager());
            newNode->setNodeValue( ((DOMDocumentImpl *)fDocument)->getPooledString(newNodeValue) );

            if (offset>= 3999)
                fMemoryManager->deallocate(newNodeValue);//delete[] newNodeValue;

        }
        return newNode;
    }
    else
    {
        XMLSize_t endLen = XMLString::stringLen(fEndContainer->getNodeValue());
        XMLSize_t offset = getEndOffset();

        if (endLen == offset) {
            if ( how != CLONE_CONTENTS )
                n->setNodeValue(XMLUni::fgZeroLenString);
        }
        else {
            XMLCh* oldNodeValue;
            XMLCh oldTemp[4000];

            if (offset >= 3999)  {
                oldNodeValue = (XMLCh*) fMemoryManager->allocate
                (
                    (offset+1) * sizeof(XMLCh)
                );//new XMLCh[offset+1];
            }
            else {
                oldNodeValue = oldTemp;
            }
            XMLString::subString(oldNodeValue, txtValue, offset, endLen, ((DOMDocumentImpl *)fDocument)->getMemoryManager());

            if ( how != CLONE_CONTENTS )
                n->setNodeValue( ((DOMDocumentImpl *)fDocument)->getPooledString(oldNodeValue) );

            if (offset>= 3999)
                fMemoryManager->deallocate(oldNodeValue);//delete[] oldNodeValue;
        }

        if ( how==DELETE_CONTENTS )
            return 0;

        DOMNode* newNode = n->cloneNode( false );

        if (offset == 0) {
            newNode->setNodeValue(XMLUni::fgZeroLenString);
        }
        else {
            XMLCh* newNodeValue;
            XMLCh newTemp[4000];

            if (offset >= 3999)  {
                newNodeValue = (XMLCh*) fMemoryManager->allocate
                (
                    (offset+1) * sizeof(XMLCh)
                );//new XMLCh[offset+1];
            }
            else {
                newNodeValue = newTemp;
            }
            XMLString::subString(newNodeValue, txtValue, 0, offset, ((DOMDocumentImpl *)fDocument)->getMemoryManager());
            newNode->setNodeValue( ((DOMDocumentImpl *)fDocument)->getPooledString(newNodeValue) );

            if (offset>= 3999)
                fMemoryManager->deallocate(newNodeValue);//delete[] newNodeValue;

        }
        return newNode;
    }
}